

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_snode(lyout *out,lys_node *parent,lys_node *node,char *label)

{
  size_t sVar1;
  char *pcVar2;
  lys_node *plVar3;
  char *label_local;
  lys_node *node_local;
  lys_node *parent_local;
  lyout *out_local;
  
  sVar1 = strlen(label);
  if (9 < sVar1) {
    __assert_fail("strlen(label) < INDENT_LEN-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_info.c"
                  ,0x43,
                  "void info_print_snode(struct lyout *, const struct lys_node *, const struct lys_node *, const char *)"
                 );
  }
  ly_print(out,"%-*s",0xb,label);
  if (node == (lys_node *)0x0) {
    ly_print(out,"\n");
  }
  else {
    if (node->name == (char *)0x0) {
      pcVar2 = "output";
      if (node->nodetype == LYS_INPUT) {
        pcVar2 = "input";
      }
      ly_print(out,"%s\n",pcVar2);
    }
    else {
      pcVar2 = strnodetype(node->nodetype);
      ly_print(out,"%s \"",pcVar2);
      plVar3 = lys_parent(node);
      if (parent != plVar3) {
        ly_print(out,"%s:",node->module->prefix);
      }
      ly_print(out,"%s\"\n",node->name);
    }
    for (label_local = (char *)node->next; label_local != (char *)0x0;
        label_local = *(char **)(label_local + 0x50)) {
      if (*(long *)label_local == 0) {
        pcVar2 = "output";
        if (*(int *)(label_local + 0x38) == 0x200) {
          pcVar2 = "input";
        }
        ly_print(out,"%*s%s\n",0xb,"",pcVar2);
      }
      else {
        pcVar2 = strnodetype(*(LYS_NODE *)(label_local + 0x38));
        ly_print(out,"%*s%s \"",0xb,"",pcVar2);
        plVar3 = lys_parent((lys_node *)label_local);
        if (parent != plVar3) {
          ly_print(out,"%s:",*(undefined8 *)(*(long *)(label_local + 0x30) + 0x10));
        }
        ly_print(out,"%s\"\n",*(undefined8 *)label_local);
      }
    }
  }
  return;
}

Assistant:

static void
info_print_snode(struct lyout *out, const struct lys_node *parent, const struct lys_node *node, const char *label)
{
    assert(strlen(label) < INDENT_LEN-1);

    ly_print(out, "%-*s", INDENT_LEN, label);

    if (node) {
        if (node->name) {
            ly_print(out, "%s \"", strnodetype(node->nodetype));
            if (parent != lys_parent(node)) {
                ly_print(out, "%s:", node->module->prefix);
            }
            ly_print(out, "%s\"\n", node->name);
        } else {
            ly_print(out, "%s\n", (node->nodetype == LYS_INPUT ? "input" : "output"));
        }
        node = node->next;
        for (; node; node = node->next) {
            if (node->name) {
                ly_print(out, "%*s%s \"", INDENT_LEN, "", strnodetype(node->nodetype));
                if (parent != lys_parent(node)) {
                    ly_print(out, "%s:", node->module->prefix);
                }
                ly_print(out, "%s\"\n", node->name);
            } else {
                ly_print(out, "%*s%s\n", INDENT_LEN, "", (node->nodetype == LYS_INPUT ? "input" : "output"));
            }
        }
    } else {
        ly_print(out, "\n");
    }
}